

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

MDDOpts FlatZinc::anon_unknown_4::getMDDOpts(Node *ann)

{
  pointer ppNVar1;
  bool bVar2;
  Call *this;
  Array *pAVar3;
  long lVar4;
  Decomp DVar5;
  Node **i;
  pointer ppNVar6;
  MDDOpts MVar7;
  MDDOpts mopts;
  allocator local_61;
  MDDOpts local_60;
  string local_50;
  
  local_60.expl_alg = E_GREEDY;
  local_60.expl_strat = E_KEEP;
  local_60.decomp = D_PROP;
  DVar5 = D_PROP;
  if (ann != (Node *)0x0) {
    std::__cxx11::string::string((string *)&local_50,"mdd",&local_61);
    bVar2 = AST::Node::hasCall(ann,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    DVar5 = D_PROP;
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_50,"mdd",&local_61);
      this = AST::Node::getCall(ann,&local_50);
      pAVar3 = AST::Node::getArray(&this->super_Node);
      std::__cxx11::string::~string((string *)&local_50);
      ppNVar1 = (pAVar3->a).
                super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppNVar6 = (pAVar3->a).
                     super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; DVar5 = local_60.decomp,
          ppNVar6 != ppNVar1; ppNVar6 = ppNVar6 + 1) {
        if ((*ppNVar6 != (Node *)0x0) &&
           (lVar4 = __dynamic_cast(*ppNVar6,&AST::Node::typeinfo,&AST::Atom::typeinfo,0), lVar4 != 0
           )) {
          MDDOpts::parse_arg(&local_60,(string *)(lVar4 + 8));
        }
      }
    }
  }
  MVar7.decomp = DVar5;
  MVar7.expl_alg = local_60.expl_alg;
  MVar7.expl_strat = local_60.expl_strat;
  return MVar7;
}

Assistant:

inline MDDOpts getMDDOpts(AST::Node* ann) {
	MDDOpts mopts;
	if (ann != nullptr) {
		if (ann->hasCall("mdd")) {
			AST::Array* args(ann->getCall("mdd")->getArray());
			for (auto& i : args->a) {
				if (auto* at = dynamic_cast<AST::Atom*>(i)) {
					mopts.parse_arg(at->id);
				}
			}
		}
	}
	return mopts;
}